

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto_storage.c
# Opt level: O0

psa_status_t
psa_save_persistent_key(psa_core_key_attributes_t *attr,uint8_t *data,size_t data_length)

{
  uint8_t *storage_data_00;
  psa_status_t status;
  uint8_t *storage_data;
  size_t storage_data_length;
  size_t data_length_local;
  uint8_t *data_local;
  psa_core_key_attributes_t *attr_local;
  
  if (data_length < 0x2000) {
    storage_data_00 = (uint8_t *)calloc(1,data_length + 0x24);
    if (storage_data_00 == (uint8_t *)0x0) {
      attr_local._4_4_ = -0x8d;
    }
    else {
      psa_format_key_data_for_storage(data,data_length,attr,storage_data_00);
      attr_local._4_4_ = psa_crypto_storage_store(attr->id,storage_data_00,data_length + 0x24);
      free(storage_data_00);
    }
  }
  else {
    attr_local._4_4_ = -0x8e;
  }
  return attr_local._4_4_;
}

Assistant:

psa_status_t psa_save_persistent_key( const psa_core_key_attributes_t *attr,
                                      const uint8_t *data,
                                      const size_t data_length )
{
    size_t storage_data_length;
    uint8_t *storage_data;
    psa_status_t status;

    if( data_length > PSA_CRYPTO_MAX_STORAGE_SIZE )
        return PSA_ERROR_INSUFFICIENT_STORAGE;
    storage_data_length = data_length + sizeof( psa_persistent_key_storage_format );

    storage_data = mbedtls_calloc( 1, storage_data_length );
    if( storage_data == NULL )
        return( PSA_ERROR_INSUFFICIENT_MEMORY );

    psa_format_key_data_for_storage( data, data_length, attr, storage_data );

    status = psa_crypto_storage_store( attr->id,
                                       storage_data, storage_data_length );

    mbedtls_free( storage_data );

    return( status );
}